

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

bool kratos::GeneratorPortVisitor::correct_src_type(Var *src,Generator *generator)

{
  VarType VVar1;
  int iVar2;
  int iVar3;
  element_type *this;
  Var **ppVVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_4a;
  bool local_49;
  undefined1 local_28 [8];
  shared_ptr<kratos::VarCasted> casted;
  Generator *generator_local;
  Var *src_local;
  
  casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)generator;
  VVar1 = Var::type(src);
  generator_local = (Generator *)src;
  if (VVar1 == BaseCasted) {
    Var::as<kratos::VarCasted>((Var *)local_28);
    this = std::__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
    ppVVar4 = VarCasted::parent_var(this);
    generator_local = (Generator *)*ppVVar4;
    std::shared_ptr<kratos::VarCasted>::~shared_ptr((shared_ptr<kratos::VarCasted> *)local_28);
  }
  VVar1 = Var::type((Var *)generator_local);
  local_49 = true;
  if (VVar1 != Base) {
    VVar1 = Var::type((Var *)generator_local);
    local_49 = true;
    if (VVar1 != ConstValue) {
      VVar1 = Var::type((Var *)generator_local);
      local_49 = true;
      if (VVar1 != Parameter) {
        VVar1 = Var::type((Var *)generator_local);
        local_4a = false;
        if (VVar1 == PortIO) {
          iVar2 = (*(generator_local->super_IRNode)._vptr_IRNode[4])();
          iVar3 = (*(casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base[4])();
          local_4a = CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3);
        }
        local_49 = local_4a;
      }
    }
  }
  return local_49;
}

Assistant:

static inline bool correct_src_type(Var* src, Generator* generator) {
        if (src->type() == VarType::BaseCasted) {
            auto casted = src->as<VarCasted>();
            src = casted->parent_var();
        }
        return src->type() == VarType::Base || src->type() == VarType::ConstValue ||
               src->type() == VarType::Parameter ||
               (src->type() == VarType::PortIO && src->parent() == generator->parent());
    }